

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * __thiscall Omega_h::CallOp::eval(any *__return_storage_ptr__,CallOp *this,ExprEnv *env)

{
  Args *this_00;
  long *plVar1;
  storage_union *psVar2;
  pointer psVar3;
  iterator iVar4;
  iterator iVar5;
  ostream *poVar6;
  ParserFail *this_01;
  undefined8 uVar7;
  long unaff_RBP;
  long lVar8;
  storage_union *psVar9;
  ulong uVar10;
  storage_union *psVar11;
  stringstream ss;
  string local_1d8;
  storage_union local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  this_00 = &this->args;
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::resize
            (this_00,(long)(this->rhs).
                           super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->rhs).
                           super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar3 = (this->rhs).
           super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rhs).
      super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    unaff_RBP = 0;
    lVar8 = 0;
    uVar10 = 0;
    do {
      plVar1 = *(long **)((long)&(psVar3->
                                 super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar8);
      (**(code **)(*plVar1 + 0x10))(&local_1b8,plVar1,env);
      any::operator=((any *)((long)&((this_00->
                                     super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->storage +
                            unaff_RBP),(any *)&local_1b8);
      if (local_1a8[0] != 0) {
        (**(code **)(local_1a8[0] + 8))(&local_1b8);
        local_1a8[0] = 0;
      }
      uVar10 = uVar10 + 1;
      psVar3 = (this->rhs).
               super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
      unaff_RBP = unaff_RBP + 0x18;
    } while (uVar10 < (ulong)((long)(this->rhs).
                                    super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4))
    ;
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
                  *)env,&this->name);
  if ((_Rb_tree_header *)iVar4._M_node == &(env->variables)._M_t._M_impl.super__Rb_tree_header) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>_>
            ::find(&(env->functions)._M_t,&this->name);
    if ((_Rb_tree_header *)iVar5._M_node == &(env->functions)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,
                          (this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" is neither a variable nor a function name\n",0x2c);
      this_01 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      ParserFail::ParserFail(this_01,&local_1d8);
      __cxa_throw(this_01,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (iVar5._M_node[2]._M_left == (_Base_ptr)0x0) {
      uVar7 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((char)unaff_RBP != '\0') {
        __cxa_free_exception(this);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar7);
    }
    (*(code *)iVar5._M_node[2]._M_right)(__return_storage_ptr__,iVar5._M_node + 2,this_00);
    psVar9 = &((this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
               super__Vector_impl_data._M_start)->storage;
    psVar2 = &((this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
               super__Vector_impl_data._M_finish)->storage;
    psVar11 = psVar9;
    if (psVar2 == psVar9) {
      return __return_storage_ptr__;
    }
    do {
      if (psVar11[1].dynamic != (void *)0x0) {
        (**(code **)((long)psVar11[1].dynamic + 8))(psVar11);
        psVar11[1].dynamic = (void *)0x0;
      }
      psVar11 = (storage_union *)((long)psVar11 + 0x18);
    } while (psVar11 != psVar2);
  }
  else {
    anon_unknown_41::access((char *)__return_storage_ptr__,env->size);
    psVar9 = &((this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
               super__Vector_impl_data._M_start)->storage;
    psVar2 = &((this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
               super__Vector_impl_data._M_finish)->storage;
    psVar11 = psVar9;
    if (psVar2 == psVar9) {
      return __return_storage_ptr__;
    }
    do {
      if (psVar11[1].dynamic != (void *)0x0) {
        (**(code **)((long)psVar11[1].dynamic + 8))(psVar11);
        psVar11[1].dynamic = (void *)0x0;
      }
      psVar11 = (storage_union *)((long)psVar11 + 0x18);
    } while (psVar11 != psVar2);
  }
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)psVar9;
  return __return_storage_ptr__;
}

Assistant:

any CallOp::eval(ExprEnv& env) {
  args.resize(rhs.size());
  for (std::size_t i = 0; i < rhs.size(); ++i) {
    args[i] = rhs[i]->eval(env);
  }
  auto vit = env.variables.find(name);
  if (vit == env.variables.end()) {
    /* function call */
    auto fit = env.functions.find(name);
    if (fit == env.functions.end()) {
      std::stringstream ss;
      ss << "\"" << name << "\" is neither a variable nor a function name\n";
      throw ParserFail(ss.str());
    }
    auto result = fit->second(args);
    args.clear();
    return result;
  } else {
    /* access operator for vector/matrix */
    auto& val = vit->second;
    auto result = access(env.size, env.dim, val, args);
    args.clear();
    return result;
  }
}